

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

ostream * amrex::operator<<(ostream *os,PP_entry *pp)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  poVar1 = std::operator<<(os,(string *)pp);
  poVar1 = std::operator<<(poVar1,"(nvals = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,") ");
  std::operator<<(poVar1," :: [");
  uVar2 = (long)(pp->m_vals).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pp->m_vals).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = uVar2 >> 5;
  uVar3 = 0;
  uVar5 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar5 = uVar3;
  }
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    std::operator<<(os,(string *)
                       ((long)&(((pp->m_vals).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       uVar3));
    if ((long)uVar4 < (long)(uVar2 * 0x8000000 + -0x100000000) >> 0x20) {
      std::operator<<(os,", ");
    }
    uVar3 = uVar3 + 0x20;
  }
  std::operator<<(os,"]");
  if (((byte)os[*(long *)(*(long *)os + -0x18) + 0x20] & 5) != 0) {
    Error_host("write on ostream failed");
  }
  return os;
}

Assistant:

std::ostream&
operator<< (std::ostream& os, const ParmParse::PP_entry& pp)
{
    os << pp.m_name << "(nvals = " << pp.m_vals.size() << ") " << " :: [";
    int n = pp.m_vals.size();
    for ( int i = 0; i < n; i++ )
    {
        os << pp.m_vals[i];
        if ( i < n-1 ) os << ", ";
    }
    os << "]";

    if ( !os )
    {
        amrex::Error("write on ostream failed");
    }
    return os;
}